

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void skipWhitespace(void)

{
  char cVar1;
  _Bool _Var2;
  char c;
  byte local_11;
  
  do {
    cVar1 = peek();
    switch(cVar1) {
    case '\t':
    case '\r':
    case ' ':
      advance();
      break;
    case '\n':
      scanner.line = scanner.line + 1;
      advance();
      break;
    default:
      return;
    case '/':
      cVar1 = peekNext();
      if (cVar1 != '/') {
        return;
      }
      while( true ) {
        cVar1 = peek();
        local_11 = 0;
        if (cVar1 != '\n') {
          _Var2 = isAtEnd();
          local_11 = _Var2 ^ 0xff;
        }
        if ((local_11 & 1) == 0) break;
        advance();
      }
    }
  } while( true );
}

Assistant:

static void skipWhitespace() {
    for (;;) {
        char c = peek();
        switch (c) {
            case ' ':
            case '\r':
            case '\t':
                advance();
                break;
            case '\n':
                scanner.line++;
                advance();
                break;
            case '/':
                if (peekNext() == '/') {
                    // A comment goes until the end of the line.
                    while (peek() != '\n' && !isAtEnd()) advance();
                } else {
                    return;
                }
                break;
            default:
                return;
        }
    }
}